

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O3

void forth_sqrt(Forth *ptr)

{
  uint uVar1;
  long lVar2;
  runtime_error *this;
  ForthStack<unsigned_int> *this_00;
  
  if ((ptr->dStack).top != 0) {
    this_00 = &ptr->dStack;
    uVar1 = cppforth::Forth::ForthStack<unsigned_int>::getTop(this_00,0);
    cppforth::Forth::ForthStack<unsigned_int>::pop(this_00);
    lVar2 = c_sqrt((ulong)uVar1);
    cppforth::Forth::ForthStack<unsigned_int>::push(this_00,(uint)lVar2);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"forth_sqrt does not have parameters in Forth stack");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void forth_sqrt(cppforth::Forth* ptr){
	if (ptr->forth_depth() >= 1){
		auto value = ptr->forth_tocell(0); ptr->forth_pop(1);
		ptr->forth_push(c_sqrt(value));
	}
	else {
		throw std::runtime_error(("forth_sqrt does not have parameters in Forth stack"));
	}
}